

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcShapeModel::~IfcShapeModel(IfcShapeModel *this,void **vtt)

{
  void **vtt_local;
  IfcShapeModel *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcShapeModel,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcShapeModel,_0UL> *)
             &(this->super_IfcRepresentation).field_0x80,vtt + 5);
  IfcRepresentation::~IfcRepresentation(&this->super_IfcRepresentation,vtt + 1);
  return;
}

Assistant:

IfcShapeModel() : Object("IfcShapeModel") {}